

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::IntegerVectorExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,IntegerVectorExpressionSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  size_t index_local;
  IntegerVectorExpressionSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->size).kind;
    token._2_1_ = (this->size).field_0x2;
    token.numFlags.raw = (this->size).numFlags.raw;
    token.rawLen = (this->size).rawLen;
    token.info = (this->size).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->base).kind;
    token_00._2_1_ = (this->base).field_0x2;
    token_00.numFlags.raw = (this->base).numFlags.raw;
    token_00.rawLen = (this->base).rawLen;
    token_00.info = (this->base).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    token_01.kind = (this->value).kind;
    token_01._2_1_ = (this->value).field_0x2;
    token_01.numFlags.raw = (this->value).numFlags.raw;
    token_01.rawLen = (this->value).rawLen;
    token_01.info = (this->value).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax IntegerVectorExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return size;
        case 1: return base;
        case 2: return value;
        default: return nullptr;
    }
}